

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdArgs.cpp
# Opt level: O2

void __thiscall asl::CmdArgs::CmdArgs(CmdArgs *this,String *spec)

{
  uint n;
  int iVar1;
  ssize_t sVar2;
  size_t in_RCX;
  int iVar3;
  Array<char> all;
  Array<asl::String> a;
  File file;
  char buffer [256];
  Array<char> local_1c8;
  Dic<asl::String> *local_1c0;
  Dic<asl::Array<asl::String>_> *local_1b8;
  Array<asl::String> local_1b0;
  String local_1a8;
  Array<asl::String> *local_190;
  String *local_188;
  File local_180;
  String local_138 [11];
  
  Array<asl::String>::Array(&this->_args);
  Array<asl::String>::Array(&this->_rest);
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::Array
            ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)&this->_opts);
  Array<asl::Map<asl::String,_asl::Array<asl::String>_>::KeyVal>::Array
            ((Array<asl::Map<asl::String,_asl::Array<asl::String>_>::KeyVal> *)&this->_multi);
  local_190 = &this->_unused;
  Array<asl::String>::Array(local_190);
  String::String(local_138,"/proc/self/cmdline");
  File::File(&local_180,local_138,READ);
  String::~String(local_138);
  if (local_180._file != (FILE *)0x0) {
    local_1c0 = &this->_opts;
    local_1b8 = &this->_multi;
    local_188 = spec;
    Array<char>::Array(&local_1c8);
    do {
      sVar2 = File::read(&local_180,(int)local_138,(void *)0x100,in_RCX);
      n = (uint)sVar2;
      if ((int)n < 1) break;
      Array<char>::Array((Array<char> *)&local_1a8,(char *)local_138,n);
      Array<char>::append(&local_1c8,(Array<char> *)&local_1a8);
      Array<char>::~Array((Array<char> *)&local_1a8);
    } while (0x100 < n);
    if (*(int *)(local_1c8._a + -0x10) != 0) {
      Array<asl::String>::Array(&local_1b0);
      iVar3 = 0;
      while( true ) {
        local_1a8._size._0_1_ = 0;
        iVar1 = Array<char>::indexOf(&local_1c8,(char *)&local_1a8,iVar3);
        if (iVar1 == -1) break;
        String::String(&local_1a8,local_1c8._a + iVar3);
        Array<asl::String>::operator<<(&local_1b0,&local_1a8);
        String::~String(&local_1a8);
        iVar3 = iVar1 + 1;
      }
      iVar3 = *(int *)&local_1b0._a[-1].field_2;
      Array<asl::String>::with<char_const*>((Array<asl::String> *)&local_1a8);
      parse(this,iVar3,(char **)CONCAT71(local_1a8._1_7_,(undefined1)local_1a8._size),local_188);
      Array<const_char_*>::~Array((Array<const_char_*> *)&local_1a8);
      Array<asl::String>::~Array(&local_1b0);
    }
    Array<char>::~Array(&local_1c8);
  }
  File::~File(&local_180);
  return;
}

Assistant:

CmdArgs::CmdArgs(const String& spec)
{
#ifdef _WIN32
	int nArgs = 0;
	LPWSTR* wargs = CommandLineToArgvW(GetCommandLineW(), &nArgs);
	if (wargs == NULL)
		return;
	Array<String> a;
	for (int i = 0; i < nArgs; i++)
		a << wargs[i];

	LocalFree(wargs);
	parse(-nArgs, (char**)(a.with<const char*>()).data(), spec);
#else
	File file("/proc/self/cmdline", File::READ);
	if (!file)
		return;
	char buffer[256];
	Array<char> all;
	int n;
	while ((n = file.read(buffer, sizeof(buffer))) > 0)
	{
		all.append(Array<char>((char*)buffer, n));
		if (n <= (int)sizeof(buffer))
			break;
	}
	if (all.length() == 0)
		return;
	int i = 0, j = 0;
	Array<String> a;
	while ((j = all.indexOf('\0', i)) != -1)
	{
		a << String(&all[i]);
		i = j + 1;
	}

	parse(a.length(), (char**)(a.with<const char*>()).data(), spec);
#endif
}